

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test.cpp
# Opt level: O2

void stackjit::TestLibrary::add(VMState *vmState)

{
  Binder *this;
  TypeProvider *pTVar1;
  Type *pTVar2;
  Type *returnType;
  PrimitiveTypes primitiveType;
  PrimitiveTypes primitiveType_00;
  initializer_list<const_stackjit::Type_*> __l;
  initializer_list<const_stackjit::Type_*> __l_00;
  allocator_type local_232;
  allocator local_231;
  Type *local_230;
  _Vector_base<const_stackjit::Type_*,_std::allocator<const_stackjit::Type_*>_> local_228;
  _Vector_base<const_stackjit::Type_*,_std::allocator<const_stackjit::Type_*>_> local_210;
  string local_1f8;
  string local_1d8;
  string local_1b8;
  string local_198;
  string local_178;
  FunctionDefinition local_158;
  FunctionDefinition local_c0;
  
  this = VMState::binder(vmState);
  pTVar1 = VMState::typeProvider(vmState);
  TypeSystem::toString_abi_cxx11_(&local_178,(TypeSystem *)0x1,primitiveType);
  pTVar2 = TypeProvider::makeType(pTVar1,&local_178);
  std::__cxx11::string::~string((string *)&local_178);
  pTVar1 = VMState::typeProvider(vmState);
  TypeSystem::toString_abi_cxx11_(&local_198,(TypeSystem *)0x0,primitiveType_00);
  returnType = TypeProvider::makeType(pTVar1,&local_198);
  std::__cxx11::string::~string((string *)&local_198);
  std::__cxx11::string::string((string *)&local_1b8,"rt.test.fib",&local_231);
  __l._M_len = 1;
  __l._M_array = &local_230;
  local_230 = pTVar2;
  std::vector<const_stackjit::Type_*,_std::allocator<const_stackjit::Type_*>_>::vector
            ((vector<const_stackjit::Type_*,_std::allocator<const_stackjit::Type_*>_> *)&local_210,
             __l,&local_232);
  FunctionDefinition::FunctionDefinition
            (&local_c0,&local_1b8,
             (vector<const_stackjit::Type_*,_std::allocator<const_stackjit::Type_*>_> *)&local_210,
             pTVar2,(BytePtr)fibonacci,(ClassType *)0x0,Public,false);
  Binder::define(this,&local_c0);
  FunctionDefinition::~FunctionDefinition(&local_c0);
  std::_Vector_base<const_stackjit::Type_*,_std::allocator<const_stackjit::Type_*>_>::~_Vector_base
            (&local_210);
  std::__cxx11::string::~string((string *)&local_1b8);
  pTVar1 = VMState::typeProvider(vmState);
  std::__cxx11::string::string((string *)&local_1d8,"Ref.Point",(allocator *)&local_230);
  pTVar2 = TypeProvider::makeType(pTVar1,&local_1d8);
  std::__cxx11::string::~string((string *)&local_1d8);
  if (pTVar2 != (Type *)0x0) {
    std::__cxx11::string::string((string *)&local_1f8,"rt.test.println",&local_231);
    __l_00._M_len = 1;
    __l_00._M_array = &local_230;
    local_230 = pTVar2;
    std::vector<const_stackjit::Type_*,_std::allocator<const_stackjit::Type_*>_>::vector
              ((vector<const_stackjit::Type_*,_std::allocator<const_stackjit::Type_*>_> *)&local_228
               ,__l_00,&local_232);
    FunctionDefinition::FunctionDefinition
              (&local_158,&local_1f8,
               (vector<const_stackjit::Type_*,_std::allocator<const_stackjit::Type_*>_> *)&local_228
               ,returnType,(BytePtr)printPoint,(ClassType *)0x0,Public,false);
    Binder::define(this,&local_158);
    FunctionDefinition::~FunctionDefinition(&local_158);
    std::_Vector_base<const_stackjit::Type_*,_std::allocator<const_stackjit::Type_*>_>::
    ~_Vector_base(&local_228);
    std::__cxx11::string::~string((string *)&local_1f8);
  }
  return;
}

Assistant:

void TestLibrary::add(VMState& vmState) {
		auto& binder = vmState.binder();
		auto intType = vmState.typeProvider().makeType(TypeSystem::toString(PrimitiveTypes::Integer));
		auto voidType = vmState.typeProvider().makeType(TypeSystem::toString(PrimitiveTypes::Void));

		binder.define(FunctionDefinition("rt.test.fib", { intType }, intType, (BytePtr)(&fibonacci)));

		auto pointType = vmState.typeProvider().makeType("Ref.Point");
		if (pointType != nullptr) {
			binder.define(FunctionDefinition("rt.test.println", { pointType }, voidType, (BytePtr)(&printPoint)));
		}
	}